

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture2DShadowGradOffset(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  Texture2D *pTVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  IVec3 local_1c;
  
  fVar2 = c->in[0].m_data[2];
  s = c->in[0].m_data[0];
  pTVar1 = c->textures[0].tex2D;
  fVar3 = (float)pTVar1->m_width;
  t = c->in[0].m_data[1];
  fVar4 = (float)pTVar1->m_height;
  fVar3 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * fVar3,c->in[1].m_data[1] * fVar4,
                     fVar3 * c->in[2].m_data[0],fVar4 * c->in[2].m_data[1]);
  local_1c.m_data._0_8_ = *(undefined8 *)(p->offset).m_data;
  pTVar1 = c->textures[0].tex2D;
  local_1c.m_data[2] = 0;
  fVar2 = tcu::sampleLevelArray2DCompare
                    ((pTVar1->m_view).m_levels,(pTVar1->m_view).m_numLevels,&c->textures[0].sampler,
                     fVar2,s,t,fVar3,&local_1c);
  (c->color).m_data[0] = fVar2;
  return;
}

Assistant:

static void		evalTexture2DShadowGradOffset		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadowOffset(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), computeLodFromGrad2D(c), p.offset.swizzle(0,1)); }